

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::~ComputeBuiltinVarCase(ComputeBuiltinVarCase *this)

{
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ComputeBuiltinVarCase_01e5a628;
  std::
  _Rb_tree<tcu::Vector<unsigned_int,_3>,_std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>,_std::_Select1st<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
  ::clear(&(this->m_progMap)._M_t);
  std::
  _Rb_tree<tcu::Vector<unsigned_int,_3>,_std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>,_std::_Select1st<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>,_deqp::gles31::Functional::LexicalCompareVec<unsigned_int,_3>,_std::allocator<std::pair<const_tcu::Vector<unsigned_int,_3>,_de::SharedPtr<glu::ShaderProgram>_>_>_>
  ::~_Rb_tree(&(this->m_progMap)._M_t);
  std::__cxx11::string::~string((string *)&this->m_varName);
  std::
  _Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
  ::~_Vector_base(&(this->m_subCases).
                   super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
                 );
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

ComputeBuiltinVarCase::~ComputeBuiltinVarCase (void)
{
	ComputeBuiltinVarCase::deinit();
}